

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_image_utils.cpp
# Opt level: O2

double crnlib::image_utils::compute_std_dev
                 (uint n,color_quad_u8 *pPixels,uint first_channel,uint num_channels)

{
  byte bVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  if (n == 0) {
    return 0.0;
  }
  dVar6 = 0.0;
  dVar7 = 0.0;
  for (uVar4 = 0; uVar4 != n; uVar4 = uVar4 + 1) {
    uVar3 = (ulong)num_channels;
    uVar2 = first_channel;
    if (num_channels == 0) {
      uVar2 = color_quad<unsigned_char,_int>::get_luma(pPixels + uVar4);
      dVar7 = dVar7 + (double)uVar2;
      dVar6 = dVar6 + (double)(uVar2 * uVar2);
    }
    else {
      while (uVar3 != 0) {
        bVar1 = pPixels[uVar4].field_0.c[uVar2];
        dVar7 = dVar7 + (double)bVar1;
        dVar6 = dVar6 + (double)((uint)bVar1 * (uint)bVar1);
        uVar3 = uVar3 - 1;
        uVar2 = uVar2 + 1;
      }
    }
  }
  dVar5 = (double)((num_channels + (num_channels == 0)) * n);
  dVar7 = dVar7 / dVar5;
  dVar6 = dVar6 / dVar5 - dVar7 * dVar7;
  if (dVar6 <= 0.0) {
    dVar6 = 0.0;
  }
  return SQRT(dVar6);
}

Assistant:

double compute_std_dev(uint n, const color_quad_u8* pPixels, uint first_channel, uint num_channels)
        {
            if (!n)
            {
                return 0.0f;
            }

            double sum = 0.0f;
            double sum2 = 0.0f;

            for (uint i = 0; i < n; i++)
            {
                const color_quad_u8& cp = pPixels[i];

                if (!num_channels)
                {
                    uint l = cp.get_luma();
                    sum += l;
                    sum2 += l * l;
                }
                else
                {
                    for (uint c = 0; c < num_channels; c++)
                    {
                        uint l = cp[first_channel + c];
                        sum += l;
                        sum2 += l * l;
                    }
                }
            }

            double w = math::maximum(1U, num_channels) * n;
            sum /= w;
            sum2 /= w;

            double var = sum2 - sum * sum;
            var = math::maximum<double>(var, 0.0f);

            return sqrt(var);
        }